

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfloat16.cpp
# Opt level: O2

void qFloatFromFloat16_fast(float *out,quint16 *in,qsizetype len)

{
  undefined1 auVar1 [16];
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined1 auVar10 [32];
  sbyte sVar11;
  uint uVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  if (len < 8) {
    if ((~(uint)qt_cpu_features[0].super___atomic_base<unsigned_long>._M_i & 0x69f6ff) == 0) {
      sVar11 = ((byte)len < 0x21) * (' ' - (byte)len);
      uVar12 = (uint)(-1 << sVar11) >> sVar11;
      auVar14 = vmovdqu16_avx512vl(*(undefined1 (*) [16])in);
      auVar15._2_2_ = (ushort)((byte)(uVar12 >> 1) & 1) * auVar14._2_2_;
      auVar15._0_2_ = (ushort)((byte)uVar12 & 1) * auVar14._0_2_;
      auVar15._4_2_ = (ushort)((byte)(uVar12 >> 2) & 1) * auVar14._4_2_;
      auVar15._6_2_ = (ushort)((byte)(uVar12 >> 3) & 1) * auVar14._6_2_;
      auVar15._8_2_ = (ushort)((byte)(uVar12 >> 4) & 1) * auVar14._8_2_;
      auVar15._10_2_ = (ushort)((byte)(uVar12 >> 5) & 1) * auVar14._10_2_;
      auVar15._12_2_ = (ushort)((byte)(uVar12 >> 6) & 1) * auVar14._12_2_;
      auVar15._14_2_ = (ushort)((byte)(uVar12 >> 7) & 1) * auVar14._14_2_;
      auVar10 = vcvtph2ps_f16c(auVar15);
      bVar2 = (bool)((byte)uVar12 & 1);
      bVar3 = (bool)((byte)(uVar12 >> 1) & 1);
      bVar4 = (bool)((byte)(uVar12 >> 2) & 1);
      bVar5 = (bool)((byte)(uVar12 >> 3) & 1);
      bVar6 = (bool)((byte)(uVar12 >> 4) & 1);
      bVar7 = (bool)((byte)(uVar12 >> 5) & 1);
      bVar8 = (bool)((byte)(uVar12 >> 6) & 1);
      bVar9 = (bool)((byte)(uVar12 >> 7) & 1);
      *out = (float)((uint)bVar2 * auVar10._0_4_ | (uint)!bVar2 * (int)*out);
      out[1] = (float)((uint)bVar3 * auVar10._4_4_ | (uint)!bVar3 * (int)out[1]);
      out[2] = (float)((uint)bVar4 * auVar10._8_4_ | (uint)!bVar4 * (int)out[2]);
      out[3] = (float)((uint)bVar5 * auVar10._12_4_ | (uint)!bVar5 * (int)out[3]);
      out[4] = (float)((uint)bVar6 * auVar10._16_4_ | (uint)!bVar6 * (int)out[4]);
      out[5] = (float)((uint)bVar7 * auVar10._20_4_ | (uint)!bVar7 * (int)out[5]);
      out[6] = (float)((uint)bVar8 * auVar10._24_4_ | (uint)!bVar8 * (int)out[6]);
      out[7] = (float)((uint)bVar9 * auVar10._28_4_ | (uint)!bVar9 * (int)out[7]);
      return;
    }
    if (3 < len) {
      auVar14._8_8_ = 0;
      auVar14._0_8_ = *(ulong *)in;
      auVar14 = vcvtph2ps_f16c(auVar14);
      *(undefined1 (*) [16])out = auVar14;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *(ulong *)(in + len + -4);
      auVar14 = vcvtph2ps_f16c(auVar1);
      *(undefined1 (*) [16])(out + len + -4) = auVar14;
      return;
    }
    lVar13 = 0;
    if (len < 1) {
      len = lVar13;
    }
    for (; len != lVar13; lVar13 = lVar13 + 1) {
      auVar14 = vcvtph2ps_f16c(ZEXT216(in[lVar13]));
      out[lVar13] = auVar14._0_4_;
    }
  }
  else {
    for (lVar13 = 8; lVar13 < len; lVar13 = lVar13 + 8) {
      auVar10 = vcvtph2ps_f16c(*(undefined1 (*) [16])(in + lVar13 + -8));
      *(undefined1 (*) [32])(out + lVar13 + -8) = auVar10;
    }
    auVar10 = vcvtph2ps_f16c(*(undefined1 (*) [16])(in + len + -8));
    *(undefined1 (*) [32])(out + len + -8) = auVar10;
  }
  return;
}

Assistant:

static void qFloatFromFloat16_fast(float *out, const quint16 *in, qsizetype len) noexcept
{
    constexpr qsizetype Step = sizeof(__m256i) / sizeof(float);
    constexpr qsizetype HalfStep = sizeof(__m128i) / sizeof(float);
    qsizetype i = 0;

    if (len >= Step) {
        auto convertOneChunk = [=](qsizetype offset) QT_FUNCTION_TARGET(F16C) {
            __m128i f16 = _mm_loadu_si128(reinterpret_cast<const __m128i *>(in + offset));
            __m256 f32 = _mm256_cvtph_ps(f16);
            _mm256_storeu_ps(out + offset, f32);
        };

        // main loop: convert Step (8) floats per iteration
        for ( ; i + Step < len; i += Step)
            convertOneChunk(i);

        // epilogue: convert the last chunk, possibly overlapping with the last
        // iteration of the loop
        return convertOneChunk(len - Step);
    }

#if QT_COMPILER_SUPPORTS_HERE(AVX512VL) && QT_COMPILER_SUPPORTS_HERE(AVX512BW)
    if (hasFastF16Avx256())
        return qFloatFromFloat16_tail_avx256(out, in, len);
#endif

    if (len >= HalfStep) {
        auto convertOneChunk = [=](qsizetype offset) QT_FUNCTION_TARGET(F16C) {
            __m128i f16 = _mm_loadl_epi64(reinterpret_cast<const __m128i *>(in + offset));
            __m128 f32 = _mm_cvtph_ps(f16);
            _mm_storeu_ps(out + offset, f32);
        };

        // two conversions, possibly overlapping
        convertOneChunk(0);
        return convertOneChunk(len - HalfStep);
    }

    // Inlining "qfloat16::operator float()":
    for ( ; i < len; ++i)
        out[i] = _mm_cvtss_f32(_mm_cvtph_ps(_mm_cvtsi32_si128(in[i])));
}